

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rattle.cpp
# Opt level: O3

void __thiscall OpenMD::Rattle::doConstraint(Rattle *this,ConstraintPairFuncPtr func)

{
  pointer ppCVar1;
  ConstraintElem *pCVar2;
  pointer ppCVar3;
  ConstraintPair *pCVar4;
  element_type *peVar5;
  bool bVar6;
  int iVar7;
  Molecule *pMVar8;
  code *pcVar9;
  pointer ppCVar10;
  pointer ppCVar11;
  ulong uVar12;
  long in_RDX;
  long *plVar13;
  MoleculeIterator mi;
  MoleculeIterator local_48;
  int local_3c;
  Rattle *local_38;
  
  if (this->doRattle_ != true) {
    return;
  }
  local_48._M_node = (_Base_ptr)0x0;
  pMVar8 = SimInfo::beginMolecule(this->info_,&local_48);
  if (pMVar8 != (Molecule *)0x0) {
    do {
      ppCVar10 = (pMVar8->constraintElems_).
                 super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar1 = (pMVar8->constraintElems_).
                super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar10 != ppCVar1) {
        pCVar2 = *ppCVar10;
        while (pCVar2 != (ConstraintElem *)0x0) {
          ppCVar10 = ppCVar10 + 1;
          ((pCVar2->moved_).
           super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          data_ = true;
          ((pCVar2->moving_).
           super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          data_ = false;
          if (ppCVar10 == ppCVar1) break;
          pCVar2 = *ppCVar10;
        }
      }
      ppCVar11 = (pMVar8->constraintPairs_).
                 super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar3 = (pMVar8->constraintPairs_).
                super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar11 != ppCVar3) {
        pCVar4 = *ppCVar11;
        while (pCVar4 != (ConstraintPair *)0x0) {
          ppCVar11 = ppCVar11 + 1;
          pCVar4->force_ = 0.0;
          if (ppCVar11 == ppCVar3) break;
          pCVar4 = *ppCVar11;
        }
      }
      pMVar8 = SimInfo::nextMolecule(this->info_,&local_48);
    } while (pMVar8 != (Molecule *)0x0);
  }
  if (this->maxConsIteration_ < 1) {
    uVar12 = 0;
  }
  else {
    plVar13 = (long *)((long)&this->info_ + in_RDX);
    uVar12 = 0;
    local_38 = this;
    do {
      local_3c = (int)uVar12;
      pMVar8 = SimInfo::beginMolecule(this->info_,&local_48);
      if (pMVar8 == (Molecule *)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = true;
        do {
          ppCVar11 = (pMVar8->constraintPairs_).
                     super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (ppCVar11 !=
              (pMVar8->constraintPairs_).
              super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pCVar4 = *ppCVar11;
            while (pCVar4 != (ConstraintPair *)0x0) {
              ppCVar11 = ppCVar11 + 1;
              if ((((pCVar4->consElem1_->moved_).
                    super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->data_ != false) ||
                 (((pCVar4->consElem2_->moved_).
                   super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->data_ == true)) {
                pcVar9 = (code *)func;
                if ((func & 1) != 0) {
                  pcVar9 = *(code **)(*plVar13 + -1 + func);
                }
                iVar7 = (*pcVar9)(plVar13,pCVar4);
                if (iVar7 != 1) {
                  if (iVar7 == 0) {
                    ((pCVar4->consElem1_->moving_).
                     super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->data_ = true;
                    ((pCVar4->consElem2_->moving_).
                     super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->data_ = true;
                    bVar6 = false;
                  }
                  else {
                    if (iVar7 == -1) {
                      builtin_strncpy(painCave.errMsg + 0x33,"t Fail\n",8);
                      builtin_strncpy(painCave.errMsg + 0x20,"nstrainA, Constrain",0x13);
                      builtin_strncpy(painCave.errMsg + 0x10,"re in Rattle::co",0x10);
                      painCave.errMsg[8] = 'n';
                      painCave.errMsg[9] = 't';
                      painCave.errMsg[10] = ' ';
                      painCave.errMsg[0xb] = 'f';
                      painCave.errMsg[0xc] = 'a';
                      painCave.errMsg[0xd] = 'i';
                      painCave.errMsg[0xe] = 'l';
                      painCave.errMsg[0xf] = 'u';
                    }
                    else {
                      builtin_strncpy(painCave.errMsg + 0x33,"ized status",0xc);
                      builtin_strncpy(painCave.errMsg + 0x20,"t() Error: unrecogn",0x13);
                      builtin_strncpy(painCave.errMsg + 0x10,"thm::doConstrain",0x10);
                      painCave.errMsg[8] = 'n';
                      painCave.errMsg[9] = 't';
                      painCave.errMsg[10] = 'A';
                      painCave.errMsg[0xb] = 'l';
                      painCave.errMsg[0xc] = 'g';
                      painCave.errMsg[0xd] = 'o';
                      painCave.errMsg[0xe] = 'r';
                      painCave.errMsg[0xf] = 'i';
                    }
                    builtin_strncpy(painCave.errMsg,"Constrai",8);
                    painCave.isFatal = 1;
                    simError();
                  }
                }
              }
              if (ppCVar11 ==
                  (pMVar8->constraintPairs_).
                  super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) break;
              pCVar4 = *ppCVar11;
            }
          }
          this = local_38;
          pMVar8 = SimInfo::nextMolecule(local_38->info_,&local_48);
        } while (pMVar8 != (Molecule *)0x0);
        bVar6 = !bVar6;
      }
      errorCheckPoint();
      pMVar8 = SimInfo::beginMolecule(this->info_,&local_48);
      while (pMVar8 != (Molecule *)0x0) {
        ppCVar10 = (pMVar8->constraintElems_).
                   super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppCVar1 = (pMVar8->constraintElems_).
                  super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppCVar10 != ppCVar1) {
          pCVar2 = *ppCVar10;
          while (pCVar2 != (ConstraintElem *)0x0) {
            ppCVar10 = ppCVar10 + 1;
            peVar5 = (pCVar2->moving_).
                     super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            ((pCVar2->moved_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            data_ = peVar5->data_;
            peVar5->data_ = false;
            if (ppCVar10 == ppCVar1) break;
            pCVar2 = *ppCVar10;
          }
        }
        pMVar8 = SimInfo::nextMolecule(this->info_,&local_48);
      }
      uVar12 = (ulong)(local_3c + 1U);
    } while ((bool)(bVar6 & (int)(local_3c + 1U) < this->maxConsIteration_));
    if (!bVar6) goto LAB_00269828;
  }
  snprintf(painCave.errMsg,2000,
           "Constraint failure in Rattle::constrainA, too many iterations: %d\n",uVar12);
  painCave.isFatal = 1;
  simError();
LAB_00269828:
  errorCheckPoint();
  return;
}

Assistant:

void Rattle::doConstraint(ConstraintPairFuncPtr func) {
    if (!doRattle_) return;

    Molecule* mol;
    SimInfo::MoleculeIterator mi;
    ConstraintElem* consElem;
    Molecule::ConstraintElemIterator cei;
    ConstraintPair* consPair;
    Molecule::ConstraintPairIterator cpi;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (consElem = mol->beginConstraintElem(cei); consElem != NULL;
           consElem = mol->nextConstraintElem(cei)) {
        consElem->setMoved(true);
        consElem->setMoving(false);
      }
      for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
           consPair = mol->nextConstraintPair(cpi)) {
        consPair->resetConstraintForce();
      }
    }

    // main loop of constraint algorithm
    int done      = 0;
    int iteration = 0;
    while (!done && iteration < maxConsIteration_) {
      done = 1;

      // loop over every constraint pair

      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
             consPair = mol->nextConstraintPair(cpi)) {
          // dispatch constraint algorithm
          if (consPair->isMoved()) {
            int exeStatus = (this->*func)(consPair);

            switch (exeStatus) {
            case consFail:
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "Constraint failure in Rattle::constrainA, "
                       "Constraint Fail\n");
              painCave.isFatal = 1;
              simError();

              break;
            case consSuccess:
              // constrain the pair by moving two elements
              done = 0;
              consPair->getConsElem1()->setMoving(true);
              consPair->getConsElem2()->setMoving(true);
              break;
            case consAlready:
              // current pair is already constrained, do not need to
              // move the elements
              break;
            default:
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "ConstraintAlgorithm::doConstraint() "
                       "Error: unrecognized status");
              painCave.isFatal = 1;
              simError();
              break;
            }
          }
        }
      }  // end for(iter->first())

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &done, 1, MPI_INT, MPI_LAND, MPI_COMM_WORLD);
#endif

      errorCheckPoint();

      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (consElem = mol->beginConstraintElem(cei); consElem != NULL;
             consElem = mol->nextConstraintElem(cei)) {
          consElem->setMoved(consElem->getMoving());
          consElem->setMoving(false);
        }
      }
      iteration++;
    }  // end while

    if (!done) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Constraint failure in Rattle::constrainA, "
               "too many iterations: %d\n",
               iteration);
      painCave.isFatal = 1;
      simError();
    }

    errorCheckPoint();
  }